

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

word ppAddMulW(word *b,word *a,size_t n,word w,void *stack)

{
  word *t;
  size_t i;
  word carry;
  void *stack_local;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  carry = 0;
  *(undefined8 *)stack = 0;
  *(word *)((long)stack + 8) = w;
  *(long *)((long)stack + 0x10) = *(long *)((long)stack + 8) << 1;
  *(ulong *)((long)stack + 0x18) = *(ulong *)((long)stack + 0x10) ^ w;
  *(long *)((long)stack + 0x20) = *(long *)((long)stack + 0x10) << 1;
  *(ulong *)((long)stack + 0x28) = *(ulong *)((long)stack + 0x20) ^ w;
  *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x18) << 1;
  *(ulong *)((long)stack + 0x38) = *(ulong *)((long)stack + 0x30) ^ w;
  *(long *)((long)stack + 0x40) = *(long *)((long)stack + 0x20) << 1;
  *(ulong *)((long)stack + 0x48) = *(ulong *)((long)stack + 0x40) ^ w;
  *(long *)((long)stack + 0x50) = *(long *)((long)stack + 0x28) << 1;
  *(ulong *)((long)stack + 0x58) = *(ulong *)((long)stack + 0x50) ^ w;
  *(long *)((long)stack + 0x60) = *(long *)((long)stack + 0x30) << 1;
  *(ulong *)((long)stack + 0x68) = *(ulong *)((long)stack + 0x60) ^ w;
  *(long *)((long)stack + 0x70) = *(long *)((long)stack + 0x38) << 1;
  *(ulong *)((long)stack + 0x78) = *(ulong *)((long)stack + 0x70) ^ w;
  for (i = 0; i < n; i = i + 1) {
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + (a[i] >> 0x3c) * 8) << 4 ^
         *(ulong *)((long)stack + (a[i] >> 0x38 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) = *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 0x34 & 0xf) * 8) << 4
         ^ *(ulong *)((long)stack + (a[i] >> 0x30 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) =
         *(long *)((long)stack + 0x88) << 8 ^ *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 0x2c & 0xf) * 8) << 4
         ^ *(ulong *)((long)stack + (a[i] >> 0x28 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) =
         *(long *)((long)stack + 0x88) << 8 ^ *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 0x24 & 0xf) * 8) << 4
         ^ *(ulong *)((long)stack + (a[i] >> 0x20 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) =
         *(long *)((long)stack + 0x88) << 8 ^ *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 0x1c & 0xf) * 8) << 4
         ^ *(ulong *)((long)stack + (a[i] >> 0x18 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) =
         *(long *)((long)stack + 0x88) << 8 ^ *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 0x14 & 0xf) * 8) << 4
         ^ *(ulong *)((long)stack + (a[i] >> 0x10 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) =
         *(long *)((long)stack + 0x88) << 8 ^ *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 0xc & 0xf) * 8) << 4
         ^ *(ulong *)((long)stack + (a[i] >> 8 & 0xf) * 8);
    *(ulong *)((long)stack + 0x88) =
         *(long *)((long)stack + 0x88) << 8 ^ *(ulong *)((long)stack + 0x80) >> 0x38;
    *(ulong *)((long)stack + 0x80) =
         *(long *)((long)stack + 0x80) << 8 ^ *(long *)((long)stack + (a[i] >> 4 & 0xf) * 8) << 4 ^
         *(ulong *)((long)stack + (a[i] & 0xf) * 8);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0xfefefefefefefefe) >> 1 & (long)w >> 0x3f ^ *(ulong *)((long)stack + 0x88);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0xfcfcfcfcfcfcfcfc) >> 2 & -(w >> 0x3e & 1) ^ *(ulong *)((long)stack + 0x88);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0xf8f8f8f8f8f8f8f8) >> 3 & -(w >> 0x3d & 1) ^ *(ulong *)((long)stack + 0x88);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0xf0f0f0f0f0f0f0f0) >> 4 & -(w >> 0x3c & 1) ^ *(ulong *)((long)stack + 0x88);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0xe0e0e0e0e0e0e0e0) >> 5 & -(w >> 0x3b & 1) ^ *(ulong *)((long)stack + 0x88);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0xc0c0c0c0c0c0c0c0) >> 6 & -(w >> 0x3a & 1) ^ *(ulong *)((long)stack + 0x88);
    *(word *)((long)stack + 0x88) =
         (a[i] & 0x8080808080808080) >> 7 & -(w >> 0x39 & 1) ^ *(ulong *)((long)stack + 0x88);
    b[i] = carry ^ *(ulong *)((long)stack + 0x80) ^ b[i];
    carry = *(word *)((long)stack + 0x88);
  }
  return carry;
}

Assistant:

word ppAddMulW(word b[], const word a[], size_t n, register word w, 
	void* stack)
{
	register word carry = 0;
	size_t i;
	word* t = (word*)stack;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	_MUL_PRE_S4(t, w);
	for (i = 0; i < n; ++i)
	{
		_MUL_MUL_S4(t[16], t[17], t, a[i]);
		_MUL_REPAIR_S4(t[17], w, a[i]);
		b[i] ^= carry ^ t[16];
		carry = t[17];
	}
	w = 0;
	return carry;
}